

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::has_active_builtin
          (Compiler *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  Bitset *local_28;
  Bitset *flags;
  StorageClass storage_local;
  BuiltIn builtin_local;
  Compiler *this_local;
  
  if (storage == Input) {
    local_28 = &this->active_input_builtins;
  }
  else {
    if (storage != Output) {
      return false;
    }
    local_28 = &this->active_output_builtins;
  }
  bVar1 = Bitset::get(local_28,builtin);
  return bVar1;
}

Assistant:

bool Compiler::has_active_builtin(BuiltIn builtin, StorageClass storage) const
{
	const Bitset *flags;
	switch (storage)
	{
	case StorageClassInput:
		flags = &active_input_builtins;
		break;
	case StorageClassOutput:
		flags = &active_output_builtins;
		break;

	default:
		return false;
	}
	return flags->get(builtin);
}